

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall
util::exception::
exception<char_const(&)[22],unsigned_char&,char_const(&)[6],CylHead&,char_const(&)[9],int&>
          (exception *this,char (*args) [22],uchar *args_1,char (*args_2) [6],CylHead *args_3,
          char (*args_4) [9],int *args_5)

{
  _Alloc_hider in_stack_ffffffffffffffd0;
  
  make_string<char_const(&)[22],unsigned_char&,char_const(&)[6],CylHead&,char_const(&)[9],int&>
            ((string *)&stack0xffffffffffffffd0,(util *)args,(char (*) [22])args_1,(uchar *)args_2,
             (char (*) [6])args_3,(CylHead *)args_4,(char (*) [9])args_5,
             (int *)in_stack_ffffffffffffffd0._M_p);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  *(undefined ***)this = &PTR__runtime_error_001dcc58;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}